

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_EnumerateCallbackResult enumFilesCallback(void *data,char *origdir,char *str)

{
  _func_void_ptr_PHYSFS_uint64 *p_Var1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *__dest;
  EnumStringListCallbackData *pecd;
  char *newstr;
  void *ptr;
  char *pcStack_28;
  PHYSFS_uint32 pos;
  char *str_local;
  char *origdir_local;
  void *data_local;
  
  ptr._4_4_ = *(uint *)((long)data + 8);
  pcStack_28 = str;
  str_local = origdir;
  origdir_local = (char *)data;
  iVar2 = locateInStringList(str,*data,(PHYSFS_uint32 *)((long)&ptr + 4));
  if (iVar2 == 0) {
    pvVar3 = (*__PHYSFS_AllocatorHooks.Realloc)(*data,(ulong)(*(int *)((long)data + 8) + 2) << 3);
    p_Var1 = __PHYSFS_AllocatorHooks.Malloc;
    sVar4 = strlen(pcStack_28);
    __dest = (char *)(*p_Var1)(sVar4 + 1);
    if ((pvVar3 == (void *)0x0) || (*(void **)data = pvVar3, __dest == (char *)0x0)) {
      if (__dest != (char *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(__dest);
      }
      *(undefined4 *)((long)data + 0xc) = 2;
      data_local._4_4_ = PHYSFS_ENUM_ERROR;
    }
    else {
      strcpy(__dest,pcStack_28);
      if (ptr._4_4_ != *(uint *)((long)data + 8)) {
        memmove((void *)(*data + (ulong)(ptr._4_4_ + 1) * 8),(void *)(*data + (ulong)ptr._4_4_ * 8),
                (ulong)(*(int *)((long)data + 8) - ptr._4_4_) << 3);
      }
      *(char **)(*data + (ulong)ptr._4_4_ * 8) = __dest;
      *(int *)((long)data + 8) = *(int *)((long)data + 8) + 1;
      data_local._4_4_ = PHYSFS_ENUM_OK;
    }
  }
  else {
    data_local._4_4_ = PHYSFS_ENUM_OK;
  }
  return data_local._4_4_;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumFilesCallback(void *data,
                                        const char *origdir, const char *str)
{
    PHYSFS_uint32 pos;
    void *ptr;
    char *newstr;
    EnumStringListCallbackData *pecd = (EnumStringListCallbackData *) data;

    /*
     * See if file is in the list already, and if not, insert it in there
     *  alphabetically...
     */
    pos = pecd->size;
    if (locateInStringList(str, pecd->list, &pos))
        return PHYSFS_ENUM_OK;  /* already in the list, but keep going. */

    ptr = allocator.Realloc(pecd->list, (pecd->size + 2) * sizeof (char *));
    newstr = (char *) allocator.Malloc(strlen(str) + 1);
    if (ptr != NULL)
        pecd->list = (char **) ptr;

    if ((ptr == NULL) || (newstr == NULL))
    {
        if (newstr)
            allocator.Free(newstr);

        pecd->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;  /* better luck next time. */
    } /* if */

    strcpy(newstr, str);

    if (pos != pecd->size)
    {
        memmove(&pecd->list[pos+1], &pecd->list[pos],
                 sizeof (char *) * ((pecd->size) - pos));
    } /* if */

    pecd->list[pos] = newstr;
    pecd->size++;

    return PHYSFS_ENUM_OK;
}